

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utilSort.c
# Opt level: O1

void Abc_QuickSort3Inc_rec(word *pData,int l,int r)

{
  word wVar1;
  word wVar2;
  uint uVar3;
  int iVar4;
  long lVar5;
  word t;
  int iVar6;
  int iVar7;
  long lVar8;
  long lVar9;
  ulong uVar10;
  int l_00;
  int iVar11;
  long lVar12;
  ulong uVar13;
  uint uVar14;
  word *pwVar15;
  ulong uVar16;
  ulong uVar17;
  word *pwVar18;
  int local_60;
  uint local_5c;
  
  uVar17 = (ulong)(uint)l;
  do {
    l_00 = (int)uVar17;
    uVar3 = r - l_00;
    if (uVar3 == 0 || r < l_00) {
      return;
    }
    if ((int)uVar3 < 10) {
      if ((int)uVar3 < 1) {
        return;
      }
      uVar16 = 1;
      uVar17 = 0;
      do {
        uVar10 = uVar17 & 0xffffffff;
        uVar13 = uVar16;
        do {
          uVar14 = (uint)uVar13;
          if ((uint)pData[(long)l_00 + (long)(int)(uint)uVar10] <= (uint)pData[(long)l_00 + uVar13])
          {
            uVar14 = (uint)uVar10;
          }
          uVar13 = uVar13 + 1;
          uVar10 = (ulong)uVar14;
        } while (uVar3 + 1 != uVar13);
        wVar1 = pData[(long)l_00 + uVar17];
        pData[(long)l_00 + uVar17] = pData[(long)l_00 + (long)(int)uVar14];
        uVar17 = uVar17 + 1;
        pData[(long)l_00 + (long)(int)uVar14] = wVar1;
        uVar16 = uVar16 + 1;
      } while (uVar17 != uVar3);
      return;
    }
    wVar1 = pData[r];
    local_5c = l_00 - 1;
    iVar4 = 0;
    uVar17 = (ulong)local_5c;
    uVar16 = (ulong)(uint)r;
    local_60 = r;
LAB_00417e3d:
    iVar11 = (int)uVar17;
    lVar5 = (long)iVar11;
    pwVar15 = pData + lVar5;
    lVar12 = 0;
    iVar7 = iVar11 + 2;
    do {
      iVar6 = iVar7;
      lVar8 = lVar12;
      pwVar18 = pwVar15;
      wVar2 = (pData + lVar5)[lVar8 + 1];
      lVar12 = lVar8 + 1;
      uVar3 = (uint)wVar1;
      pwVar15 = pwVar18 + 1;
      iVar7 = iVar6 + 1;
    } while ((uint)wVar2 < uVar3);
    uVar10 = uVar17 & 0xffffffff;
    uVar17 = lVar12 + uVar10;
    uVar13 = (long)(int)uVar16;
    do {
      lVar9 = uVar13 - 1;
      uVar16 = uVar13 - 1;
      if (l_00 + 1 == (int)uVar13) break;
      uVar13 = uVar16;
    } while (uVar3 < (uint)pData[lVar9]);
    if (lVar5 + lVar12 < (long)uVar16) {
      pData[lVar5 + lVar12] = pData[lVar9];
      pData[uVar16] = wVar2;
      if ((uint)pData[lVar5 + lVar12] == uVar3) {
        lVar8 = (long)(int)local_5c;
        local_5c = local_5c + 1;
        wVar2 = pData[lVar8 + 1];
        pData[lVar8 + 1] = pData[lVar5 + lVar12];
        pData[lVar5 + lVar12] = wVar2;
      }
      wVar2 = pData[uVar16];
      if (uVar3 == (uint)wVar2) {
        lVar5 = (long)local_60;
        local_60 = local_60 + -1;
        pData[uVar16] = pData[lVar5 + -1];
        pData[lVar5 + -1] = wVar2;
        uVar17 = (ulong)(uint)(iVar11 + (int)lVar12);
        iVar4 = iVar4 + 1;
      }
      goto LAB_00417e3d;
    }
    pData[lVar5 + lVar12] = pData[r];
    pData[r] = wVar2;
    if (l_00 < (int)local_5c) {
      lVar5 = (long)l_00;
      lVar9 = 0;
      do {
        wVar1 = pData[lVar5 + lVar9];
        pData[lVar5 + lVar9] = *pwVar18;
        *pwVar18 = wVar1;
        pwVar18 = pwVar18 + -1;
        lVar9 = lVar9 + 1;
      } while ((int)local_5c - lVar5 != lVar9);
      iVar7 = ~(uint)lVar9 + iVar11;
    }
    else {
      iVar7 = iVar11 + -1;
    }
    if (local_60 < r + -1) {
      lVar5 = (long)(r + -1);
      pwVar15 = pData + iVar6;
      uVar17 = (ulong)((int)lVar8 + iVar4 + iVar11 + 1);
      do {
        wVar1 = *pwVar15;
        *pwVar15 = pData[lVar5];
        pData[lVar5] = wVar1;
        lVar5 = lVar5 + -1;
        pwVar15 = pwVar15 + 1;
      } while (local_60 < lVar5);
    }
    else {
      uVar17 = lVar12 + uVar10 + 1;
    }
    Abc_QuickSort3Inc_rec(pData,l_00,iVar7 + (int)lVar12);
    uVar17 = uVar17 & 0xffffffff;
  } while( true );
}

Assistant:

void Abc_QuickSort3Inc_rec( word * pData, int l, int r )
{
    word v = pData[r];
    int k, i = l-1, j = r, p = l-1, q = r;
    if ( l >= r )
        return;
    assert( l < r );
    if ( r - l < 10 )
    {
        Abc_SelectSortInc( pData + l, r - l + 1 );
        return;
    }
    while ( 1 )
    {
        while ( (unsigned)pData[++i] < (unsigned)v );
        while ( (unsigned)v < (unsigned)pData[--j] )
            if ( j == l )
                break;
        if ( i >= j )
            break;
        ABC_SWAP( word, pData[i], pData[j] );
        if ( (unsigned)pData[i] == (unsigned)v ) 
            { p++; ABC_SWAP( word, pData[p], pData[i] ); }
        if ( (unsigned)v == (unsigned)pData[j] ) 
            { q--; ABC_SWAP( word, pData[j], pData[q] ); }
    }
    ABC_SWAP( word, pData[i], pData[r] ); 
    j = i-1; i = i+1;
    for ( k = l; k < p; k++, j-- ) 
        ABC_SWAP( word, pData[k], pData[j] );
    for ( k = r-1; k > q; k--, i++ ) 
        ABC_SWAP( word, pData[i], pData[k] );
    Abc_QuickSort3Inc_rec( pData, l, j );
    Abc_QuickSort3Inc_rec( pData, i, r );
}